

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O1

bool __thiscall TinyProcessLib::Process::try_get_exit_status(Process *this,int *exit_status)

{
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  int *piVar4;
  undefined8 uVar5;
  
  _Var2 = (this->data).id;
  if (_Var2 < 1) {
LAB_00167622:
    bVar1 = false;
  }
  else {
    _Var2 = waitpid(_Var2,exit_status,1);
    if (_Var2 < 0) {
      piVar4 = __errno_location();
      if (*piVar4 != 10) goto LAB_001675e0;
      *exit_status = (this->data).exit_status;
    }
    else {
LAB_001675e0:
      if (_Var2 < 1) goto LAB_00167622;
      if (0xff < *exit_status) {
        *exit_status = (uint)*exit_status >> 8;
      }
      (this->data).exit_status = *exit_status;
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->close_mutex);
      if (iVar3 != 0) {
        uVar5 = std::__throw_system_error(iVar3);
        __clang_call_terminate(uVar5);
      }
      this->closed = true;
      pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex);
      close_fds(this);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Process::try_get_exit_status(int &exit_status) noexcept {
  if(data.id <= 0)
    return false;

  const id_type p = waitpid(data.id, &exit_status, WNOHANG);
  if(p < 0 && errno == ECHILD) {
    // PID doesn't exist anymore, set previously sampled exit status (or -1)
    exit_status = data.exit_status;
    return true;
  }
  else if(p <= 0) {
    // Process still running (p==0) or error
    return false;
  }
  else {
    // store exit status for future calls
    if(exit_status >= 256)
      exit_status = exit_status >> 8;
    data.exit_status = exit_status;
  }

  {
    std::lock_guard<std::mutex> lock(close_mutex);
    closed = true;
  }
  close_fds();

  return true;
}